

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

void assert_wait_child(pid_t child_pid)

{
  uint uVar1;
  char *pcVar2;
  undefined8 uStack_30;
  int child_stat;
  
  uVar1 = waitpid(child_pid,&child_stat,0);
  printf("Waited pid is %d with status %d\n",(ulong)uVar1,(ulong)(uint)child_stat);
  if (uVar1 == 0xffffffff) {
    perror("Failed to wait");
  }
  if (uVar1 == child_pid) {
    if ((child_stat & 0x7fU) == 0) {
      if ((child_stat & 0xff00U) == 0) {
        return;
      }
      pcVar2 = "0 == WEXITSTATUS(child_stat)";
      uStack_30 = 0x58;
    }
    else {
      pcVar2 = "WIFEXITED(child_stat)";
      uStack_30 = 0x56;
    }
  }
  else {
    pcVar2 = "child_pid == waited_pid";
    uStack_30 = 0x55;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
          ,uStack_30,pcVar2);
  abort();
}

Assistant:

static void assert_wait_child(pid_t child_pid) {
  pid_t waited_pid;
  int child_stat;

  waited_pid = waitpid(child_pid, &child_stat, 0);
  printf("Waited pid is %d with status %d\n", waited_pid, child_stat);
  if (waited_pid == -1) {
    perror("Failed to wait");
  }
  ASSERT(child_pid == waited_pid);
  ASSERT(WIFEXITED(child_stat)); /* Clean exit, not a signal. */
  ASSERT(!WIFSIGNALED(child_stat));
  ASSERT(0 == WEXITSTATUS(child_stat));
}